

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O1

Value * __thiscall cmFileAPI::BuildReplyIndex(Value *__return_storage_ptr__,cmFileAPI *this)

{
  _Rb_tree_header *p_Var1;
  Value *pVVar2;
  Value *this_00;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  BuildCMake(&local_80,this);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"cmake");
  Json::Value::operator=(pVVar2,&local_80);
  Json::Value::~Value(&local_80);
  BuildReply(&local_a8,this,&this->TopQuery);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"reply");
  pVVar2 = Json::Value::operator=(pVVar2,&local_a8);
  Json::Value::~Value(&local_a8);
  p_Var3 = (this->ClientQueries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->ClientQueries)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    do {
      BuildClientReply(&local_58,this,(ClientQuery *)(p_Var3 + 2));
      this_00 = Json::Value::operator[](pVVar2,(string *)(p_Var3 + 1));
      Json::Value::operator=(this_00,&local_58);
      Json::Value::~Value(&local_58);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  Json::Value::Value(&local_d0,arrayValue);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"objects");
  pVVar2 = Json::Value::operator=(pVVar2,&local_d0);
  Json::Value::~Value(&local_d0);
  for (p_Var4 = (this->ReplyIndexObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->ReplyIndexObjects)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    Json::Value::append(pVVar2,(Value *)&p_Var4[1]._M_left);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildReplyIndex()
{
  Json::Value index(Json::objectValue);

  // Report information about this version of CMake.
  index["cmake"] = this->BuildCMake();

  // Reply to all queries that we loaded.
  Json::Value& reply = index["reply"] = this->BuildReply(this->TopQuery);
  for (auto const& client : this->ClientQueries) {
    std::string const& clientName = client.first;
    ClientQuery const& clientQuery = client.second;
    reply[clientName] = this->BuildClientReply(clientQuery);
  }

  // Move our index of generated objects into its field.
  Json::Value& objects = index["objects"] = Json::arrayValue;
  for (auto& entry : this->ReplyIndexObjects) {
    objects.append(std::move(entry.second)); // NOLINT(*)
  }

  return index;
}